

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week12-app3.cpp
# Opt level: O1

ostream * operator<<(ostream *str,Student *stu)

{
  ostream *poVar1;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (str,(stu->name).super_String._M_dataplus._M_p,
                      (stu->name).super_String._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>((double)(stu->gpa).value);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return str;
}

Assistant:

std::ostream& operator<<(std::ostream& str, const Student& stu)
{
    str << stu.name << ", " << stu.gpa.value << std::endl;
    return str;
}